

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::write_utf8_string(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,string_view *sv)

{
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  d_first;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  d_first_00;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  d_first_01;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  d_first_02;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  d_first_03;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  d_first_04;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  d_first_05;
  bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *pbVar1;
  bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *pbVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  undefined8 in_RDI;
  value_type c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  size_t length;
  undefined7 in_stack_ffffffffffffff58;
  uint8_t in_stack_ffffffffffffff5f;
  bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff60;
  uchar uVar5;
  unsigned_short val;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  unsigned_long in_stack_ffffffffffffff88;
  uint val_00;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  in_stack_ffffffffffffff90;
  
  pbVar1 = (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
           std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
  val = (unsigned_short)((ulong)in_RDI >> 0x30);
  if (pbVar1 < (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)0x18)
  {
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    d_first.container._7_1_ = in_stack_ffffffffffffff87;
    d_first.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              ((uchar)((ulong)in_RDI >> 0x38),d_first);
  }
  else if (pbVar1 < (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                    0x100) {
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    uVar5 = (uchar)((ulong)in_RDI >> 0x38);
    d_first_00.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_00.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              (uVar5,d_first_00);
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    d_first_01.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_01.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              (uVar5,d_first_01);
  }
  else if (pbVar1 < (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                    0x10000) {
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    d_first_02.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_02.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              ((uchar)(val >> 8),d_first_02);
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    d_first_03.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_03.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              (val,d_first_03);
  }
  else if (pbVar1 < (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                    0x100000000) {
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    val_00 = (uint)(in_stack_ffffffffffffff88 >> 0x20);
    d_first_04.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_04.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              ((uchar)((ulong)in_RDI >> 0x38),d_first_04);
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    binary::
    native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              (val_00,in_stack_ffffffffffffff90);
  }
  else {
    pbVar2 = (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
             std::numeric_limits<unsigned_long>::max();
    uVar5 = (uchar)((ulong)in_RDI >> 0x38);
    if (pbVar1 <= pbVar2) {
      std::
      back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      d_first_05.container._7_1_ = in_stack_ffffffffffffff87;
      d_first_05.container._0_7_ = in_stack_ffffffffffffff80;
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                (uVar5,d_first_05);
      std::
      back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      binary::
      native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff60 = pbVar1;
    }
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(in_RSI);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(in_RSI);
  for (; pvVar3 != pvVar4; pvVar3 = pvVar3 + 1) {
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  }
  return;
}

Assistant:

void write_utf8_string(const string_view& sv)
    {
        const size_t length = sv.size();

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x60 + length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x78), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x79), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x7a), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x7b), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                            std::back_inserter(sink_));
        }

        for (auto c : sv)
        {
            sink_.push_back(c);
        }
    }